

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

bool __thiscall wabt::anon_unknown_24::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  Enum EVar1;
  BinaryReader *this_local;
  Type type_local;
  
  this_local._0_4_ = type.enum_;
  EVar1 = Type::operator_cast_to_Enum((Type *)&this_local);
  switch(EVar1) {
  case ExnRef:
    this_local._7_1_ = Features::exceptions_enabled(&this->options_->features);
    break;
  default:
    this_local._7_1_ = false;
    break;
  case ExternRef:
  case FuncRef:
    this_local._7_1_ = Features::reference_types_enabled(&this->options_->features);
    break;
  case V128:
    this_local._7_1_ = Features::simd_enabled(&this->options_->features);
    break;
  case F64:
  case F32:
  case I64:
  case I32:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::FuncRef:
    case Type::ExternRef:
      return options_.features.reference_types_enabled();

    case Type::ExnRef:
      return options_.features.exceptions_enabled();

    default:
      return false;
  }
}